

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

bool QBenchmarkValgrindUtils::runCallgrindSubProcess(QStringList *origAppArgs,int *exitCode)

{
  initializer_list<QString> args_00;
  bool bVar1;
  byte bVar2;
  undefined4 uVar3;
  qsizetype qVar4;
  undefined4 *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  bool finishedOk;
  QString *arg;
  int i;
  QString *execFile;
  QProcess process;
  QStringList args;
  undefined4 in_stack_fffffffffffffe18;
  OpenModeFlag in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  QList<QString> *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  char16_t *in_stack_fffffffffffffe38;
  FILE *in_stack_fffffffffffffe48;
  QByteArray *in_stack_fffffffffffffe50;
  long *local_180;
  int local_158;
  undefined1 local_d0 [24];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  QLatin1StringView local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  long local_80 [15];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::at((QList<QString> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                     ,CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s
            (in_stack_fffffffffffffe38,CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
            );
  Qt::Literals::StringLiterals::operator____s
            (in_stack_fffffffffffffe38,CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
            );
  Qt::Literals::StringLiterals::operator____s
            (in_stack_fffffffffffffe38,CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
            );
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (QString *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  Qt::Literals::StringLiterals::operator____s
            (in_stack_fffffffffffffe38,CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
            );
  args_00._M_array._7_1_ = in_stack_fffffffffffffe37;
  args_00._M_array._0_7_ = in_stack_fffffffffffffe30;
  args_00._M_len = (size_type)in_stack_fffffffffffffe38;
  QList<QString>::QList(in_stack_fffffffffffffe28,args_00);
  local_180 = &local_8;
  do {
    local_180 = local_180 + -3;
    QString::~QString((QString *)0x1ad1da);
  } while (local_180 != local_80);
  for (local_158 = 1; qVar4 = QList<QString>::size(in_RDI), local_158 < qVar4;
      local_158 = local_158 + 1) {
    QList<QString>::at((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_a8 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffe28,
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    bVar1 = ::operator==((QString *)in_stack_fffffffffffffe28,
                         (QLatin1StringView *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (!bVar1) {
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (parameter_type)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
  }
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_b8,(QObject *)0x0);
  Qt::Literals::StringLiterals::operator____s
            (in_stack_fffffffffffffe38,CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
            );
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),in_stack_fffffffffffffe1c
            );
  QProcess::start((QString *)&local_b8,(QList_conflict *)local_d0,(QFlags_conflict *)&local_98);
  QString::~QString((QString *)0x1ad3c3);
  QProcess::waitForStarted((int)&local_b8);
  QProcess::processId();
  outFileBase((qint64)in_stack_fffffffffffffe50);
  QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (QString *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  QString::~QString((QString *)0x1ad429);
  bVar2 = QProcess::waitForFinished((int)&local_b8);
  uVar3 = QProcess::exitCode();
  *in_RSI = uVar3;
  QProcess::readAllStandardOutput();
  dumpOutput(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  QByteArray::~QByteArray((QByteArray *)0x1ad4ac);
  QProcess::readAllStandardError();
  dumpOutput(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  QByteArray::~QByteArray((QByteArray *)0x1ad4e9);
  bVar2 = bVar2 & 1;
  QProcess::~QProcess((QProcess *)&local_b8);
  QList<QString>::~QList((QList<QString> *)0x1ad50e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QBenchmarkValgrindUtils::runCallgrindSubProcess(const QStringList &origAppArgs, int &exitCode)
{
    const QString &execFile = origAppArgs.at(0);
    QStringList args{ u"--tool=callgrind"_s, u"--instr-atstart=yes"_s,
                      u"--quiet"_s, execFile, u"-callgrindchild"_s };

    // pass on original arguments that make sense (e.g. avoid wasting time producing output
    // that will be ignored anyway) ...
    for (int i = 1; i < origAppArgs.size(); ++i) {
        const QString &arg = origAppArgs.at(i);
        if (arg == "-callgrind"_L1)
            continue;
        args << arg; // ok to pass on
    }

    QProcess process;
    process.start(u"valgrind"_s, args);
    process.waitForStarted(-1);
    QBenchmarkGlobalData::current->callgrindOutFileBase =
        QBenchmarkValgrindUtils::outFileBase(process.processId());
    const bool finishedOk = process.waitForFinished(-1);
    exitCode = process.exitCode();

    dumpOutput(process.readAllStandardOutput(), stdout);
    dumpOutput(process.readAllStandardError(), stderr);

    return finishedOk;
}